

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBed(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  
  pvVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                     (&this->m_references,(long)a->RefID);
  poVar4 = std::operator<<(&this->m_out,(string *)pvVar3);
  poVar4 = std::operator<<(poVar4,'\t');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,a->Position);
  poVar4 = std::operator<<(poVar4,'\t');
  iVar2 = BamAlignment::GetEndPosition(a,false,false);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,'\t');
  poVar4 = std::operator<<(poVar4,(string *)a);
  poVar4 = std::operator<<(poVar4,'\t');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,a->MapQuality);
  poVar4 = std::operator<<(poVar4,'\t');
  bVar1 = BamAlignment::IsReverseStrand(a);
  poVar4 = std::operator<<(poVar4,bVar1 * '\x02' + '+');
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintBed(const BamAlignment& a)
{

    // tab-delimited, 0-based half-open
    // (e.g. a 50-base read aligned to pos 10 could have BED coordinates (10, 60) instead of BAM coordinates (10, 59) )
    // <chromName> <chromStart> <chromEnd> <readName> <score> <strand>

    m_out << m_references.at(a.RefID).RefName << '\t' << a.Position << '\t' << a.GetEndPosition()
          << '\t' << a.Name << '\t' << a.MapQuality << '\t' << (a.IsReverseStrand() ? '-' : '+')
          << std::endl;
}